

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
::
nosize_unchecked_emplace_at<std::pair<slang::ast::Symbol_const*&&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::ast::Symbol_*&&,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *ptVar3;
  uint uVar4;
  ushort uVar5;
  Scope *pSVar6;
  underlying_type uVar7;
  Symbol *pSVar8;
  RandomizeDetails *pRVar9;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var10;
  SymbolIndex SVar11;
  undefined4 uVar12;
  ulong uVar13;
  value_type_pointer ppVar14;
  long lVar15;
  group_type_pointer pgVar16;
  undefined1 auVar17 [16];
  
  pgVar16 = __return_storage_ptr__->pg;
  uVar13 = (ulong)__return_storage_ptr__->n;
  ppVar14 = __return_storage_ptr__->p;
  lVar15 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar17[0] = -(pgVar2->m[0].n == '\0');
    auVar17[1] = -(pgVar2->m[1].n == '\0');
    auVar17[2] = -(pgVar2->m[2].n == '\0');
    auVar17[3] = -(pgVar2->m[3].n == '\0');
    auVar17[4] = -(pgVar2->m[4].n == '\0');
    auVar17[5] = -(pgVar2->m[5].n == '\0');
    auVar17[6] = -(pgVar2->m[6].n == '\0');
    auVar17[7] = -(pgVar2->m[7].n == '\0');
    auVar17[8] = -(pgVar2->m[8].n == '\0');
    auVar17[9] = -(pgVar2->m[9].n == '\0');
    auVar17[10] = -(pgVar2->m[10].n == '\0');
    auVar17[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar17[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar17[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar17[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar17[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar5 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe;
    if (uVar5 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar4 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar13 = (ulong)uVar4;
      ppVar14 = arrays_->elements_ + pos0 * 0xf + uVar13;
      ppVar14->first = *args->first;
      ptVar3 = args->second;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
           (ptVar3->
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
      pSVar6 = (ptVar3->
               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
               ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
      SVar11 = (ptVar3->
               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
               ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
      uVar12 = *(undefined4 *)
                &(ptVar3->
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
      uVar7 = (ptVar3->
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
      pSVar8 = (ptVar3->
               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
               ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
      pRVar9 = (ptVar3->
               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
               ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
           (ptVar3->
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails = pRVar9;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar7;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc = pSVar8;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Tuple_impl<1UL,_slang::ast::ASTContext>.
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr = pSVar6;
      p_Var10 = &(ppVar14->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
      ;
      (p_Var10->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar11;
      *(undefined4 *)
       &(p_Var10->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar12;
      (ppVar14->second).
      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
      super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
           (ptVar3->
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           ).super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl;
      pgVar1->m[uVar13].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar16 = pgVar1;
    }
    if (uVar5 != 0) break;
    pos0 = pos0 + lVar15 & arrays_->groups_size_mask;
    lVar15 = lVar15 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar13;
  __return_storage_ptr__->p = ppVar14;
  __return_storage_ptr__->pg = pgVar16;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }